

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall httplib::Server::read_content(Server *this,Stream *strm,Request *req,Response *res)

{
  iterator res_00;
  bool bVar1;
  long lVar2;
  ulong uVar3;
  allocator local_121;
  string local_120;
  string local_100;
  string *local_e0;
  string *content_type;
  ContentReceiver local_d0;
  anon_class_24_3_e9c7ffdf local_a0;
  MultipartContentHeader local_88;
  anon_class_8_1_ba1d73fe local_68;
  ContentReceiver local_60;
  int local_3c;
  undefined1 local_38 [4];
  int file_count;
  iterator cur;
  Response *res_local;
  Request *req_local;
  Stream *strm_local;
  Server *this_local;
  
  cur._M_node = (_Base_ptr)res;
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::MultipartFormData>_>
  ::_Rb_tree_iterator((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::MultipartFormData>_>
                       *)local_38);
  res_00._M_node = cur._M_node;
  local_3c = 0;
  local_68.req = req;
  std::function<bool(char_const*,unsigned_long)>::
  function<httplib::Server::read_content(httplib::Stream&,httplib::Request&,httplib::Response&)::_lambda(char_const*,unsigned_long)_1_,void>
            ((function<bool(char_const*,unsigned_long)> *)&local_60,&local_68);
  local_a0.file_count = &local_3c;
  local_a0.cur = (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::MultipartFormData>_>
                  *)local_38;
  local_a0.req = req;
  std::function<bool(httplib::MultipartFormData_const&)>::
  function<httplib::Server::read_content(httplib::Stream&,httplib::Request&,httplib::Response&)::_lambda(httplib::MultipartFormData_const&)_1_,void>
            ((function<bool(httplib::MultipartFormData_const&)> *)&local_88,&local_a0);
  content_type = (string *)local_38;
  std::function<bool(char_const*,unsigned_long)>::
  function<httplib::Server::read_content(httplib::Stream&,httplib::Request&,httplib::Response&)::_lambda(char_const*,unsigned_long)_2_,void>
            ((function<bool(char_const*,unsigned_long)> *)&local_d0,
             (anon_class_8_1_ba1d3da0 *)&content_type);
  bVar1 = read_content_core(this,strm,req,(Response *)res_00._M_node,&local_60,&local_88,&local_d0);
  std::function<bool_(const_char_*,_unsigned_long)>::~function(&local_d0);
  std::function<bool_(const_httplib::MultipartFormData_&)>::~function(&local_88);
  std::function<bool_(const_char_*,_unsigned_long)>::~function(&local_60);
  if (!bVar1) {
    return false;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_120,"Content-Type",&local_121);
  Request::get_header_value(&local_100,req,&local_120,0);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  local_e0 = &local_100;
  lVar2 = std::__cxx11::string::find((char *)local_e0,0x1e9739);
  if (lVar2 == 0) {
    uVar3 = std::__cxx11::string::size();
    if (0x2000 < uVar3) {
      cur._M_node[1]._M_color = 0x19d;
      this_local._7_1_ = false;
      goto LAB_001d0a1f;
    }
    detail::parse_query_text(&req->body,&req->params);
  }
  this_local._7_1_ = true;
LAB_001d0a1f:
  std::__cxx11::string::~string((string *)&local_100);
  return this_local._7_1_;
}

Assistant:

inline bool Server::read_content(Stream &strm, Request &req, Response &res) {
  MultipartFormDataMap::iterator cur;
  auto file_count = 0;
  if (read_content_core(
          strm, req, res,
          // Regular
          [&](const char *buf, size_t n) {
            if (req.body.size() + n > req.body.max_size()) { return false; }
            req.body.append(buf, n);
            return true;
          },
          // Multipart
          [&](const MultipartFormData &file) {
            if (file_count++ == CPPHTTPLIB_MULTIPART_FORM_DATA_FILE_MAX_COUNT) {
              return false;
            }
            cur = req.files.emplace(file.name, file);
            return true;
          },
          [&](const char *buf, size_t n) {
            auto &content = cur->second.content;
            if (content.size() + n > content.max_size()) { return false; }
            content.append(buf, n);
            return true;
          })) {
    const auto &content_type = req.get_header_value("Content-Type");
    if (!content_type.find("application/x-www-form-urlencoded")) {
      if (req.body.size() > CPPHTTPLIB_FORM_URL_ENCODED_PAYLOAD_MAX_LENGTH) {
        res.status = 413; // NOTE: should be 414?
        return false;
      }
      detail::parse_query_text(req.body, req.params);
    }
    return true;
  }
  return false;
}